

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  int *piVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  int32_t iVar6;
  int32_t iVar7;
  double dVar5;
  bool bVar8;
  int iVar9;
  fpclass_type fVar10;
  fpclass_type fVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  int32_t iVar15;
  undefined4 uVar16;
  int32_t iVar17;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar18;
  undefined8 uVar19;
  int iVar20;
  undefined8 *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  int *piVar23;
  long lVar24;
  long lVar25;
  pointer pnVar26;
  VarStatus **ppVVar27;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  uint *puVar29;
  undefined4 *puVar30;
  cpp_dec_float<200U,_int,_void> *pcVar31;
  cpp_dec_float<200U,_int,_void> *pcVar32;
  uint *puVar33;
  soplex *psVar34;
  cpp_dec_float<200u,int,void> *this_00;
  pointer pnVar35;
  undefined4 *puVar36;
  VarStatus VVar37;
  int *piVar38;
  long in_FS_OFFSET;
  bool bVar39;
  byte bVar40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_18;
  fpclass_type local_e68;
  undefined1 local_e58 [16];
  undefined1 local_e48 [16];
  undefined1 local_e38 [16];
  undefined1 local_e28 [16];
  undefined1 local_e18 [16];
  undefined1 local_e08 [16];
  uint local_df8 [3];
  undefined3 uStack_deb;
  int iStack_de8;
  bool bStack_de4;
  undefined8 local_de0 [2];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_dd0;
  int local_dc4;
  cpp_dec_float<200U,_int,_void> *local_dc0;
  int *local_db8;
  undefined8 uStack_db0;
  cpp_dec_float<200U,_int,_void> *local_da0;
  undefined1 local_d98 [32];
  undefined1 local_d78 [16];
  undefined1 local_d68 [16];
  undefined1 local_d58 [16];
  undefined1 local_d48 [16];
  undefined1 local_d38 [13];
  undefined3 uStack_d2b;
  int iStack_d28;
  bool bStack_d24;
  undefined8 local_d20;
  cpp_dec_float<200U,_int,_void> local_d18;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c98;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c90;
  cpp_dec_float<200U,_int,_void> local_c88;
  cpp_dec_float<200U,_int,_void> local_c08;
  undefined1 local_b88 [32];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [13];
  undefined3 uStack_b1b;
  int iStack_b18;
  bool bStack_b14;
  undefined8 local_b10;
  undefined1 local_b08 [32];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [13];
  undefined3 uStack_a9b;
  int iStack_a98;
  bool bStack_a94;
  undefined8 local_a90;
  undefined1 local_a88 [32];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [13];
  undefined3 uStack_a1b;
  int iStack_a18;
  bool bStack_a14;
  undefined8 local_a10;
  cpp_dec_float<200U,_int,_void> local_a08;
  cpp_dec_float<200U,_int,_void> local_988;
  undefined1 local_908 [32];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [13];
  undefined3 uStack_89b;
  undefined5 uStack_898;
  undefined8 local_890;
  cpp_dec_float<200U,_int,_void> local_880;
  cpp_dec_float<200U,_int,_void> local_800;
  cpp_dec_float<200U,_int,_void> local_780;
  cpp_dec_float<200U,_int,_void> local_700;
  cpp_dec_float<200U,_int,_void> local_680;
  cpp_dec_float<200U,_int,_void> local_600;
  uint local_580 [28];
  uint local_510 [28];
  uint local_4a0 [28];
  uint local_430 [28];
  undefined4 local_3c0 [28];
  undefined4 local_350 [28];
  undefined4 local_2e0 [28];
  undefined4 local_270 [28];
  uint local_200 [28];
  uint local_190 [28];
  undefined4 local_120 [28];
  uint local_b0 [28];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar40 = 0;
  iVar20 = this->m_j;
  iVar9 = this->m_old_j;
  if (iVar20 != iVar9) {
    pnVar35 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar29 = (uint *)(pnVar35 + iVar20);
    puVar33 = (uint *)(pnVar35 + iVar9);
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar33 = *puVar29;
      puVar29 = puVar29 + 1;
      puVar33 = puVar33 + 1;
    }
    pnVar35[iVar9].m_backend.exp = pnVar35[iVar20].m_backend.exp;
    pnVar35[iVar9].m_backend.neg = pnVar35[iVar20].m_backend.neg;
    iVar17 = pnVar35[iVar20].m_backend.prec_elem;
    pnVar35[iVar9].m_backend.fpclass = pnVar35[iVar20].m_backend.fpclass;
    pnVar35[iVar9].m_backend.prec_elem = iVar17;
    iVar20 = this->m_j;
    pnVar35 = (r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = this->m_old_j;
    puVar29 = (uint *)(pnVar35 + iVar20);
    puVar33 = (uint *)(pnVar35 + iVar9);
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar33 = *puVar29;
      puVar29 = puVar29 + 1;
      puVar33 = puVar33 + 1;
    }
    pnVar35[iVar9].m_backend.exp = pnVar35[iVar20].m_backend.exp;
    pnVar35[iVar9].m_backend.neg = pnVar35[iVar20].m_backend.neg;
    iVar17 = pnVar35[iVar20].m_backend.prec_elem;
    pnVar35[iVar9].m_backend.fpclass = pnVar35[iVar20].m_backend.fpclass;
    pnVar35[iVar9].m_backend.prec_elem = iVar17;
    iVar20 = this->m_j;
    cStatus->data[this->m_old_j] = cStatus->data[iVar20];
  }
  local_dd0 = s;
  local_c90 = y;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_d18,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,iVar20);
  iVar20 = this->m_i;
  pnVar35 = (local_dd0->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar26 = pnVar35 + iVar20;
  puVar30 = local_120;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar30 = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
  }
  iVar9 = pnVar35[iVar20].m_backend.exp;
  bVar39 = pnVar35[iVar20].m_backend.neg;
  uVar13._0_4_ = pnVar35[iVar20].m_backend.fpclass;
  uVar13._4_4_ = pnVar35[iVar20].m_backend.prec_elem;
  uStack_db0 = 0;
  local_890._0_4_ = cpp_dec_float_finite;
  local_890._4_4_ = 0x1c;
  local_908._0_16_ = (undefined1  [16])0x0;
  local_908._16_16_ = (undefined1  [16])0x0;
  local_8e8 = (undefined1  [16])0x0;
  local_8d8 = (undefined1  [16])0x0;
  local_8c8 = (undefined1  [16])0x0;
  local_8b8 = (undefined1  [16])0x0;
  local_8a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_89b = 0;
  uStack_898._0_4_ = 0;
  uStack_898._4_1_ = false;
  local_db8 = (int *)uVar13;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_908,1e-06);
  puVar30 = local_120;
  puVar36 = (undefined4 *)local_e58;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar36 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
    puVar36 = puVar36 + (ulong)bVar40 * -2 + 1;
  }
  bStack_de4 = bVar39;
  if ((bVar39 == true) && (local_e58._0_4_ != 0 || (fpclass_type)local_db8 != cpp_dec_float_finite))
  {
    bStack_de4 = false;
  }
  piVar38 = &this->m_i;
  bVar39 = (fpclass_type)local_db8 == cpp_dec_float_NaN;
  iStack_de8 = iVar9;
  local_de0[0] = uVar13;
  local_db8 = piVar38;
  if (((bVar39) || ((fpclass_type)local_890 == cpp_dec_float_NaN)) ||
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e58,
                          (cpp_dec_float<200U,_int,_void> *)local_908), 0 < iVar20)) {
    pcVar22 = &(local_dd0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*piVar38].m_backend;
    ::soplex::infinity::__tls_init();
    local_de0[0]._0_4_ = cpp_dec_float_finite;
    local_de0[0]._4_4_ = 0x1c;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8[0] = 0;
    local_df8[1] = 0;
    stack0xfffffffffffff210 = 0;
    uStack_deb = 0;
    iStack_de8 = 0;
    bStack_de4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e58,*(double *)(in_FS_OFFSET + -8));
    if (((pcVar22->fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_de0[0] != cpp_dec_float_NaN)) &&
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar22,(cpp_dec_float<200U,_int,_void> *)local_e58), -1 < iVar20)) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_e58._0_8_ = local_e48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e58,"Simplifier: infinite activities - aborting unsimplification",
                 "");
      *puVar21 = &PTR__SPxException_0069d438;
      puVar21[1] = puVar21 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar21 + 1),local_e58._0_8_,
                 (undefined1 *)(local_e58._0_8_ + local_e58._8_8_));
      __cxa_throw(puVar21,&SPxException::typeinfo,SPxException::~SPxException);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)
               ((local_dd0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *piVar38),0.0);
  }
  iStack_de8 = (this->m_lhs).m_backend.exp;
  bStack_de4 = (this->m_lhs).m_backend.neg;
  iVar20 = this->m_i;
  pnVar35 = (local_dd0->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  fVar10 = (this->m_lhs).m_backend.fpclass;
  iVar14 = (this->m_lhs).m_backend.prec_elem;
  pnVar26 = pnVar35 + iVar20;
  puVar30 = local_350;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar30 = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
  }
  iVar9 = pnVar35[iVar20].m_backend.exp;
  bVar39 = pnVar35[iVar20].m_backend.neg;
  fVar3 = pnVar35[iVar20].m_backend.fpclass;
  iVar6 = pnVar35[iVar20].m_backend.prec_elem;
  pnVar28 = &this->m_lhs;
  puVar29 = (uint *)local_e58;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar29 = (pnVar28->m_backend).data._M_elems[0];
    pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
    puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
  }
  local_de0[0]._0_4_ = fVar10;
  local_de0[0]._4_4_ = iVar14;
  if ((bStack_de4 == true) && (local_e58._0_4_ != 0 || fVar10 != cpp_dec_float_finite)) {
    bStack_de4 = false;
  }
  puVar30 = local_350;
  puVar36 = (undefined4 *)local_d98;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar36 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
    puVar36 = puVar36 + (ulong)bVar40 * -2 + 1;
  }
  iStack_d28 = iVar9;
  bStack_d24 = bVar39;
  local_d20._0_4_ = fVar3;
  local_d20._4_4_ = iVar6;
  if ((bVar39 != false) && (fVar3 != cpp_dec_float_finite || local_d98._0_4_ != 0)) {
    bStack_d24 = (bool)(bVar39 ^ 1);
  }
  if ((fVar10 == cpp_dec_float_NaN) || (fVar3 == cpp_dec_float_NaN)) {
LAB_00579e85:
    puVar21 = &local_d20;
    puVar29 = (uint *)local_d98;
    pcVar22 = &local_c08;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar22->data)._M_elems[0] = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    local_c08.exp = iStack_d28;
    local_c08.neg = bStack_d24;
    local_c08.fpclass = fVar3;
  }
  else {
    iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)local_e58,
                        (cpp_dec_float<200U,_int,_void> *)local_d98);
    if (iVar20 < 1) {
      fVar3 = (fpclass_type)local_d20;
      goto LAB_00579e85;
    }
    puVar29 = (uint *)local_e58;
    pcVar22 = &local_c08;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar22->data)._M_elems[0] = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    local_c08.exp = iStack_de8;
    local_c08.neg = bStack_de4;
    local_c08.fpclass = (fpclass_type)local_de0[0];
    puVar21 = local_de0;
  }
  local_c08.prec_elem = *(int32_t *)((long)puVar21 + 4);
  iStack_de8 = (this->m_rhs).m_backend.exp;
  bStack_de4 = (this->m_rhs).m_backend.neg;
  iVar20 = this->m_i;
  pnVar35 = (local_dd0->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  fVar11 = (this->m_rhs).m_backend.fpclass;
  iVar15 = (this->m_rhs).m_backend.prec_elem;
  pnVar26 = pnVar35 + iVar20;
  puVar30 = local_3c0;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar30 = (pnVar26->m_backend).data._M_elems[0];
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
  }
  iVar9 = pnVar35[iVar20].m_backend.exp;
  bVar39 = pnVar35[iVar20].m_backend.neg;
  fVar4 = pnVar35[iVar20].m_backend.fpclass;
  iVar7 = pnVar35[iVar20].m_backend.prec_elem;
  pnVar28 = &this->m_rhs;
  puVar29 = (uint *)local_e58;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar29 = (pnVar28->m_backend).data._M_elems[0];
    pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
    puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
  }
  local_de0[0]._0_4_ = fVar11;
  local_de0[0]._4_4_ = iVar15;
  if ((bStack_de4 == true) && (local_e58._0_4_ != 0 || fVar11 != cpp_dec_float_finite)) {
    bStack_de4 = false;
  }
  puVar30 = local_3c0;
  puVar36 = (undefined4 *)local_d98;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar36 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
    puVar36 = puVar36 + (ulong)bVar40 * -2 + 1;
  }
  iStack_d28 = iVar9;
  bStack_d24 = bVar39;
  local_d20._0_4_ = fVar4;
  local_d20._4_4_ = iVar7;
  if ((bVar39 != false) && (fVar4 != cpp_dec_float_finite || local_d98._0_4_ != 0)) {
    bStack_d24 = (bool)(bVar39 ^ 1);
  }
  if ((fVar11 == cpp_dec_float_NaN) || (fVar4 == cpp_dec_float_NaN)) {
LAB_0057a020:
    puVar21 = &local_d20;
    puVar29 = (uint *)local_d98;
    pcVar22 = &local_c88;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar22->data)._M_elems[0] = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    local_c88.exp = iStack_d28;
    local_c88.neg = bStack_d24;
    local_c88.fpclass = fVar4;
  }
  else {
    iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)local_e58,
                        (cpp_dec_float<200U,_int,_void> *)local_d98);
    if (iVar20 < 1) {
      fVar4 = (fpclass_type)local_d20;
      goto LAB_0057a020;
    }
    puVar29 = (uint *)local_e58;
    pcVar22 = &local_c88;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar22->data)._M_elems[0] = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    local_c88.exp = iStack_de8;
    local_c88.neg = bStack_de4;
    local_c88.fpclass = (fpclass_type)local_de0[0];
    puVar21 = local_de0;
  }
  local_c88.prec_elem = *(int32_t *)((long)puVar21 + 4);
  if (local_c08.fpclass != cpp_dec_float_NaN) {
    local_de0[0]._0_4_ = cpp_dec_float_finite;
    local_de0[0]._4_4_ = 0x1c;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8[0] = 0;
    local_df8[1] = 0;
    stack0xfffffffffffff210 = 0;
    uStack_deb = 0;
    iStack_de8 = 0;
    bStack_de4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e58,1.0);
    iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_c08,(cpp_dec_float<200U,_int,_void> *)local_e58);
    if (iVar20 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_c08,1.0);
    }
  }
  local_c98 = r;
  if (local_c88.fpclass != cpp_dec_float_NaN) {
    local_de0[0]._0_4_ = cpp_dec_float_finite;
    local_de0[0]._4_4_ = 0x1c;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8[0] = 0;
    local_df8[1] = 0;
    stack0xfffffffffffff210 = 0;
    uStack_deb = 0;
    iStack_de8 = 0;
    bStack_de4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e58,1.0);
    iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_c88,(cpp_dec_float<200U,_int,_void> *)local_e58);
    if (iVar20 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_c88,1.0);
    }
  }
  local_de0[0]._0_4_ = cpp_dec_float_finite;
  local_de0[0]._4_4_ = 0x1c;
  local_e58 = (undefined1  [16])0x0;
  local_e48 = (undefined1  [16])0x0;
  local_e38 = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08 = (undefined1  [16])0x0;
  local_df8[0] = 0;
  local_df8[1] = 0;
  stack0xfffffffffffff210 = 0;
  uStack_deb = 0;
  iStack_de8 = 0;
  bStack_de4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_e58,&(this->m_lhs).m_backend,&local_c08);
  pVVar18 = local_dd0;
  local_d20._0_4_ = cpp_dec_float_finite;
  local_d20._4_4_ = 0x1c;
  local_d98._0_16_ = (undefined1  [16])0x0;
  local_d98._16_16_ = (undefined1  [16])0x0;
  local_d78 = (undefined1  [16])0x0;
  local_d68 = (undefined1  [16])0x0;
  local_d58 = (undefined1  [16])0x0;
  local_d48 = (undefined1  [16])0x0;
  local_d38 = SUB1613((undefined1  [16])0x0,0);
  uStack_d2b = 0;
  iStack_d28 = 0;
  bStack_d24 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_d98,
             &(local_dd0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&local_c08);
  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_e58;
  pcVar31 = &local_988;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    (pcVar31->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar40 * -8 + 4);
    pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar40 * -8 + 4);
  }
  local_988.exp = iStack_de8;
  local_988.neg = bStack_de4;
  local_988.fpclass = (fpclass_type)local_de0[0];
  local_988.prec_elem = local_de0[0]._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&local_988,(cpp_dec_float<200U,_int,_void> *)local_d98);
  local_de0[0]._0_4_ = cpp_dec_float_finite;
  local_de0[0]._4_4_ = 0x1c;
  local_e58 = (undefined1  [16])0x0;
  local_e48 = (undefined1  [16])0x0;
  local_e38 = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08 = (undefined1  [16])0x0;
  local_df8[0] = 0;
  local_df8[1] = 0;
  stack0xfffffffffffff210 = 0;
  uStack_deb = 0;
  iStack_de8 = 0;
  bStack_de4 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_e58,&(this->m_rhs).m_backend,&local_c88);
  local_d20._0_4_ = cpp_dec_float_finite;
  local_d20._4_4_ = 0x1c;
  local_d98._0_16_ = (undefined1  [16])0x0;
  local_d98._16_16_ = (undefined1  [16])0x0;
  local_d78 = (undefined1  [16])0x0;
  local_d68 = (undefined1  [16])0x0;
  local_d58 = (undefined1  [16])0x0;
  local_d48 = (undefined1  [16])0x0;
  local_d38 = SUB1613((undefined1  [16])0x0,0);
  uStack_d2b = 0;
  iStack_d28 = 0;
  bStack_d24 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_d98,
             &(pVVar18->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&local_c88);
  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_e58;
  pcVar31 = &local_a08;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    (pcVar31->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar40 * -8 + 4);
    pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar40 * -8 + 4);
  }
  local_a08.exp = iStack_de8;
  local_a08.neg = bStack_de4;
  local_a08.fpclass = (fpclass_type)local_de0[0];
  local_a08.prec_elem = local_de0[0]._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&local_a08,(cpp_dec_float<200U,_int,_void> *)local_d98);
  uVar13 = local_988._120_8_;
  bVar39 = local_988.neg;
  iVar20 = local_988.exp;
  pcVar22 = &local_988;
  puVar29 = local_190;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar29 = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar40 * -8 + 4);
    puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
  }
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_680,this);
  puVar29 = local_190;
  puVar33 = (uint *)local_e58;
  for (lVar24 = 0x1c; uVar19 = local_988._120_8_, piVar38 = local_db8, lVar24 != 0;
      lVar24 = lVar24 + -1) {
    *puVar33 = *puVar29;
    puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
    puVar33 = puVar33 + (ulong)bVar40 * -2 + 1;
  }
  iStack_de8 = iVar20;
  bStack_de4 = bVar39;
  local_988.fpclass = (fpclass_type)uVar13;
  local_988.prec_elem = SUB84(uVar13,4);
  local_de0[0]._0_4_ = local_988.fpclass;
  local_de0[0]._4_4_ = local_988.prec_elem;
  local_e68 = (fpclass_type)uVar13;
  if ((bVar39 == true) && (local_e58._0_4_ != 0 || local_e68 != cpp_dec_float_finite)) {
    bStack_de4 = false;
  }
  local_988._120_8_ = uVar19;
  if (((local_e68 != cpp_dec_float_NaN) && (local_680.fpclass != cpp_dec_float_NaN)) &&
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e58,&local_680), iVar20 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_988,0.0);
  }
  uVar13 = local_a08._120_8_;
  bVar39 = local_a08.neg;
  iVar20 = local_a08.exp;
  pcVar22 = &local_a08;
  puVar29 = local_200;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar29 = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar40 * -2 + 1) * 4);
    puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
  }
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_700);
  puVar29 = local_200;
  puVar33 = (uint *)local_e58;
  for (lVar24 = 0x1c; uVar19 = local_a08._120_8_, lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar33 = *puVar29;
    puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
    puVar33 = puVar33 + (ulong)bVar40 * -2 + 1;
  }
  iStack_de8 = iVar20;
  bStack_de4 = bVar39;
  local_a08.fpclass = (fpclass_type)uVar13;
  local_a08.prec_elem = SUB84(uVar13,4);
  local_de0[0]._0_4_ = local_a08.fpclass;
  local_de0[0]._4_4_ = local_a08.prec_elem;
  local_e68 = (fpclass_type)uVar13;
  if ((bVar39 == true) && (local_e58._0_4_ != 0 || local_e68 != cpp_dec_float_finite)) {
    bStack_de4 = false;
  }
  local_a08._120_8_ = uVar19;
  if (((local_e68 != cpp_dec_float_NaN) && (local_700.fpclass != cpp_dec_float_NaN)) &&
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e58,&local_700), iVar20 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a08,0.0);
  }
  if (local_d18.fpclass == cpp_dec_float_NaN) {
LAB_0057a568:
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_d98;
    pcVar31 = &local_a08;
    pcVar32 = pcVar22;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar32->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
      pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + ((ulong)bVar40 * -2 + 1) * 4);
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar40 * -8 + 4);
    }
    iStack_d28 = local_a08.exp;
    bStack_d24 = local_a08.neg;
    local_d20._0_4_ = local_a08.fpclass;
    local_d20._4_4_ = local_a08.prec_elem;
    pcVar31 = &local_c88;
  }
  else {
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_e58;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (pcVar22,0,(type *)0x0);
    iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_d18,pcVar22);
    if (iVar20 < 1) goto LAB_0057a568;
    pcVar31 = &local_988;
    pcVar32 = pcVar22;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar32->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
      pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + ((ulong)bVar40 * -2 + 1) * 4);
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar40 * -8 + 4);
    }
    iStack_de8 = local_988.exp;
    bStack_de4 = local_988.neg;
    local_de0[0]._0_4_ = local_988.fpclass;
    local_de0[0]._4_4_ = local_988.prec_elem;
    pcVar31 = &local_c08;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(pcVar22,pcVar31);
  local_a90._0_4_ = cpp_dec_float_finite;
  local_a90._4_4_ = 0x1c;
  local_b08._0_16_ = (undefined1  [16])0x0;
  local_b08._16_16_ = (undefined1  [16])0x0;
  local_ae8 = (undefined1  [16])0x0;
  local_ad8 = (undefined1  [16])0x0;
  local_ac8 = (undefined1  [16])0x0;
  local_ab8 = (undefined1  [16])0x0;
  local_aa8 = SUB1613((undefined1  [16])0x0,0);
  uStack_a9b = 0;
  iStack_a98 = 0;
  bStack_a94 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_b08,pcVar22,&local_d18);
  if (local_d18.fpclass == cpp_dec_float_NaN) {
LAB_0057a661:
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_d98;
    pcVar31 = &local_988;
    pcVar32 = pcVar22;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar32->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
      pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + ((ulong)bVar40 * -2 + 1) * 4);
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar40 * -8 + 4);
    }
    iStack_d28 = local_988.exp;
    bStack_d24 = local_988.neg;
    local_d20._0_4_ = local_988.fpclass;
    local_d20._4_4_ = local_988.prec_elem;
    pcVar31 = &local_c08;
  }
  else {
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_e58;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (pcVar22,0,(type *)0x0);
    iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_d18,pcVar22);
    if (iVar20 < 1) goto LAB_0057a661;
    pcVar31 = &local_a08;
    pcVar32 = pcVar22;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar32->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
      pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + ((ulong)bVar40 * -2 + 1) * 4);
      pcVar32 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar32 + (ulong)bVar40 * -8 + 4);
    }
    iStack_de8 = local_a08.exp;
    bStack_de4 = local_a08.neg;
    local_de0[0]._0_4_ = local_a08.fpclass;
    local_de0[0]._4_4_ = local_a08.prec_elem;
    pcVar31 = &local_c88;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(pcVar22,pcVar31);
  local_b10._0_4_ = cpp_dec_float_finite;
  local_b10._4_4_ = 0x1c;
  local_b88._0_16_ = (undefined1  [16])0x0;
  local_b88._16_16_ = (undefined1  [16])0x0;
  local_b68 = (undefined1  [16])0x0;
  local_b58 = (undefined1  [16])0x0;
  local_b48 = (undefined1  [16])0x0;
  local_b38 = (undefined1  [16])0x0;
  local_b28 = SUB1613((undefined1  [16])0x0,0);
  uStack_b1b = 0;
  iStack_b18 = 0;
  bStack_b14 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_b88,pcVar22,&local_d18);
  uVar13 = local_a90;
  bVar39 = bStack_a94;
  iVar20 = iStack_a98;
  puVar30 = (undefined4 *)local_b08;
  puVar36 = local_270;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar36 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
    puVar36 = puVar36 + (ulong)bVar40 * -2 + 1;
  }
  (*(this->super_PostStep)._vptr_PostStep[6])(&local_780);
  puVar30 = local_270;
  puVar36 = (undefined4 *)local_e58;
  for (lVar24 = 0x1c; uVar19 = local_a90, lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar36 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
    puVar36 = puVar36 + (ulong)bVar40 * -2 + 1;
  }
  iStack_de8 = iVar20;
  bStack_de4 = bVar39;
  local_a90._0_4_ = (fpclass_type)uVar13;
  local_a90._4_4_ = SUB84(uVar13,4);
  local_de0[0]._0_4_ = (fpclass_type)local_a90;
  local_de0[0]._4_4_ = local_a90._4_4_;
  local_e68 = (fpclass_type)uVar13;
  if ((bVar39 == true) && (local_e58._0_4_ != 0 || local_e68 != cpp_dec_float_finite)) {
    bStack_de4 = false;
  }
  local_a90 = uVar19;
  if (((local_e68 != cpp_dec_float_NaN) && (local_780.fpclass != cpp_dec_float_NaN)) &&
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e58,&local_780), iVar20 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_b08,0.0);
  }
  uVar13 = local_b10;
  bVar39 = bStack_b14;
  iVar20 = iStack_b18;
  puVar30 = (undefined4 *)local_b88;
  puVar36 = local_2e0;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar36 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
    puVar36 = puVar36 + (ulong)bVar40 * -2 + 1;
  }
  (*(this->super_PostStep)._vptr_PostStep[6])(&local_800);
  puVar30 = local_2e0;
  puVar36 = (undefined4 *)local_e58;
  for (lVar24 = 0x1c; uVar19 = local_b10, lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar36 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
    puVar36 = puVar36 + (ulong)bVar40 * -2 + 1;
  }
  iStack_de8 = iVar20;
  bStack_de4 = bVar39;
  local_b10._0_4_ = (fpclass_type)uVar13;
  local_b10._4_4_ = SUB84(uVar13,4);
  local_de0[0]._0_4_ = (fpclass_type)local_b10;
  local_de0[0]._4_4_ = local_b10._4_4_;
  local_e68 = (fpclass_type)uVar13;
  if ((bVar39 == true) && (local_e58._0_4_ != 0 || local_e68 != cpp_dec_float_finite)) {
    bStack_de4 = false;
  }
  local_b10 = uVar19;
  if (((local_e68 != cpp_dec_float_NaN) && (local_800.fpclass != cpp_dec_float_NaN)) &&
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e58,&local_800), iVar20 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_b88,0.0);
  }
  uVar13 = local_a90;
  bVar39 = bStack_a94;
  if (BASIC < rStatus->data[*piVar38]) {
switchD_0057a8a0_caseD_3:
    puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_e58._0_8_ = local_e48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e58,"XMAISM04 This should never happen.","");
    *puVar21 = &PTR__SPxException_0069d438;
    puVar21[1] = puVar21 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar21 + 1),local_e58._0_8_,
               (undefined1 *)(local_e58._0_8_ + local_e58._8_8_));
    *puVar21 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar21,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  piVar1 = &this->m_j;
  piVar23 = piVar1;
  switch(rStatus->data[*piVar38]) {
  case ON_UPPER:
    ::soplex::infinity::__tls_init();
    pnVar28 = &this->m_lower;
    dVar5 = *(double *)(in_FS_OFFSET + -8);
    local_de0[0]._0_4_ = cpp_dec_float_finite;
    local_de0[0]._4_4_ = 0x1c;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8[0] = 0;
    local_df8[1] = 0;
    stack0xfffffffffffff210 = 0;
    uStack_deb = 0;
    iStack_de8 = 0;
    bStack_de4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e58,-dVar5);
    if ((((this->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
        ((fpclass_type)local_de0[0] == cpp_dec_float_NaN)) ||
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar28->m_backend,(cpp_dec_float<200U,_int,_void> *)local_e58),
       0 < iVar20)) {
LAB_0057a93d:
      if ((((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&pnVar28->m_backend,&(this->m_upper).m_backend), iVar20 == 0)) {
        pnVar26 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar24 = (long)this->m_j * 0x80;
        pnVar35 = pnVar26 + this->m_j;
        lVar25 = 0x1c;
        goto LAB_0057b732;
      }
      if (local_d18.fpclass == cpp_dec_float_NaN) goto LAB_0057bb4e;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<200U,_int,_void> *)local_e58,0,(type *)0x0);
      iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_e58);
      if (iVar20 < 1) {
        if (local_d18.fpclass == cpp_dec_float_NaN) {
LAB_0057bb4e:
          puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_e58._0_8_ = local_e48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e58,"XMAISM02 This should never happen.","");
          *puVar21 = &PTR__SPxException_0069d438;
          puVar21[1] = puVar21 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar21 + 1),local_e58._0_8_,
                     (undefined1 *)(local_e58._0_8_ + local_e58._8_8_));
          *puVar21 = &PTR__SPxException_0069d410;
          __cxa_throw(puVar21,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        VVar37 = ON_UPPER;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_e58,0,(type *)0x0);
        iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_e58);
        if (-1 < iVar20) goto LAB_0057bb4e;
        iVar20 = this->m_j;
        pnVar35 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar28 = &this->m_upper;
        pnVar26 = pnVar35 + iVar20;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
          pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
        }
        pnVar35[iVar20].m_backend.exp = (this->m_upper).m_backend.exp;
        pnVar35[iVar20].m_backend.neg = (this->m_upper).m_backend.neg;
        iVar17 = (this->m_upper).m_backend.prec_elem;
        pnVar35[iVar20].m_backend.fpclass = (this->m_upper).m_backend.fpclass;
        pnVar35[iVar20].m_backend.prec_elem = iVar17;
      }
      else {
        iVar20 = this->m_j;
        pnVar35 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar26 = pnVar35 + iVar20;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
          pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
        }
        pnVar35[iVar20].m_backend.exp = (this->m_lower).m_backend.exp;
        pnVar35[iVar20].m_backend.neg = (this->m_lower).m_backend.neg;
        iVar17 = (this->m_lower).m_backend.prec_elem;
        pnVar35[iVar20].m_backend.fpclass = (this->m_lower).m_backend.fpclass;
        pnVar35[iVar20].m_backend.prec_elem = iVar17;
        VVar37 = ON_LOWER;
      }
    }
    else {
      ::soplex::infinity::__tls_init();
      local_d20._0_4_ = cpp_dec_float_finite;
      local_d20._4_4_ = 0x1c;
      local_d98._0_16_ = (undefined1  [16])0x0;
      local_d98._16_16_ = (undefined1  [16])0x0;
      local_d78 = (undefined1  [16])0x0;
      local_d68 = (undefined1  [16])0x0;
      local_d58 = (undefined1  [16])0x0;
      local_d48 = (undefined1  [16])0x0;
      local_d38 = SUB1613((undefined1  [16])0x0,0);
      uStack_d2b = 0;
      iStack_d28 = 0;
      bStack_d24 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d98,dVar5);
      if ((((this->m_upper).m_backend.fpclass == cpp_dec_float_NaN) ||
          ((fpclass_type)local_d20 == cpp_dec_float_NaN)) ||
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&(this->m_upper).m_backend,(cpp_dec_float<200U,_int,_void> *)local_d98
                             ), iVar20 < 0)) goto LAB_0057a93d;
LAB_0057b6c2:
      this_00 = (cpp_dec_float<200u,int,void> *)
                ((x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *piVar1);
LAB_0057b6d0:
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(this_00,0.0);
      VVar37 = ZERO;
    }
    break;
  case ON_LOWER:
    ::soplex::infinity::__tls_init();
    pnVar28 = &this->m_lower;
    dVar5 = *(double *)(in_FS_OFFSET + -8);
    local_de0[0]._0_4_ = cpp_dec_float_finite;
    local_de0[0]._4_4_ = 0x1c;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8[0] = 0;
    local_df8[1] = 0;
    stack0xfffffffffffff210 = 0;
    uStack_deb = 0;
    iStack_de8 = 0;
    bStack_de4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e58,-dVar5);
    if ((((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_de0[0] != cpp_dec_float_NaN)) &&
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar28->m_backend,(cpp_dec_float<200U,_int,_void> *)local_e58),
       iVar20 < 1)) {
      ::soplex::infinity::__tls_init();
      local_d20._0_4_ = cpp_dec_float_finite;
      local_d20._4_4_ = 0x1c;
      local_d98._0_16_ = (undefined1  [16])0x0;
      local_d98._16_16_ = (undefined1  [16])0x0;
      local_d78 = (undefined1  [16])0x0;
      local_d68 = (undefined1  [16])0x0;
      local_d58 = (undefined1  [16])0x0;
      local_d48 = (undefined1  [16])0x0;
      local_d38 = SUB1613((undefined1  [16])0x0,0);
      uStack_d2b = 0;
      iStack_d28 = 0;
      bStack_d24 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d98,dVar5);
      if ((((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_d20 != cpp_dec_float_NaN)) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&(this->m_upper).m_backend,(cpp_dec_float<200U,_int,_void> *)local_d98
                             ), -1 < iVar20)) goto LAB_0057b6c2;
    }
    if ((((this->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
        ((this->m_upper).m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar28->m_backend,&(this->m_upper).m_backend), iVar20 != 0)) {
      if (local_d18.fpclass == cpp_dec_float_NaN) goto LAB_0057bacb;
      VVar37 = ON_UPPER;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<200U,_int,_void> *)local_e58,0,(type *)0x0);
      iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_e58);
      if (iVar20 < 1) {
        if (local_d18.fpclass == cpp_dec_float_NaN) {
LAB_0057bacb:
          puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_e58._0_8_ = local_e48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e58,"XMAISM01 This should never happen.","");
          *puVar21 = &PTR__SPxException_0069d438;
          puVar21[1] = puVar21 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar21 + 1),local_e58._0_8_,
                     (undefined1 *)(local_e58._0_8_ + local_e58._8_8_));
          *puVar21 = &PTR__SPxException_0069d410;
          __cxa_throw(puVar21,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_e58,0,(type *)0x0);
        iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_e58);
        if (-1 < iVar20) goto LAB_0057bacb;
        iVar20 = this->m_j;
        pnVar35 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar26 = pnVar35 + iVar20;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
          pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
        }
        pnVar35[iVar20].m_backend.exp = (this->m_lower).m_backend.exp;
        pnVar35[iVar20].m_backend.neg = (this->m_lower).m_backend.neg;
        iVar17 = (this->m_lower).m_backend.prec_elem;
        pnVar35[iVar20].m_backend.fpclass = (this->m_lower).m_backend.fpclass;
        pnVar35[iVar20].m_backend.prec_elem = iVar17;
        VVar37 = ON_LOWER;
      }
      else {
        iVar20 = this->m_j;
        pnVar35 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar28 = &this->m_upper;
        pnVar26 = pnVar35 + iVar20;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
          pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
        }
        pnVar35[iVar20].m_backend.exp = (this->m_upper).m_backend.exp;
        pnVar35[iVar20].m_backend.neg = (this->m_upper).m_backend.neg;
        iVar17 = (this->m_upper).m_backend.prec_elem;
        pnVar35[iVar20].m_backend.fpclass = (this->m_upper).m_backend.fpclass;
        pnVar35[iVar20].m_backend.prec_elem = iVar17;
      }
      ppVVar27 = &cStatus->data;
      goto LAB_0057b8ad;
    }
    pnVar26 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar24 = (long)this->m_j * 0x80;
    lVar25 = 0x1c;
    pnVar35 = pnVar26 + this->m_j;
LAB_0057b732:
    for (; lVar25 != 0; lVar25 = lVar25 + -1) {
      (pnVar35->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
      pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
      pnVar35 = (pointer)((long)pnVar35 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    *(int *)((long)(&(pnVar26->m_backend).data + 1) + lVar24) = (this->m_lower).m_backend.exp;
    *(bool *)((long)(&(pnVar26->m_backend).data + 1) + lVar24 + 4U) = (this->m_lower).m_backend.neg;
    *(undefined8 *)((long)(&(pnVar26->m_backend).data + 1) + lVar24 + 8U) =
         *(undefined8 *)&(this->m_lower).m_backend.fpclass;
    VVar37 = FIXED;
    break;
  case FIXED:
    ::soplex::infinity::__tls_init();
    pnVar28 = &this->m_lower;
    dVar5 = *(double *)(in_FS_OFFSET + -8);
    local_de0[0]._0_4_ = cpp_dec_float_finite;
    local_de0[0]._4_4_ = 0x1c;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8[0] = 0;
    local_df8[1] = 0;
    stack0xfffffffffffff210 = 0;
    uStack_deb = 0;
    iStack_de8 = 0;
    bStack_de4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e58,-dVar5);
    if ((((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_de0[0] != cpp_dec_float_NaN)) &&
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar28->m_backend,(cpp_dec_float<200U,_int,_void> *)local_e58),
       iVar20 < 1)) {
      ::soplex::infinity::__tls_init();
      local_d20._0_4_ = cpp_dec_float_finite;
      local_d20._4_4_ = 0x1c;
      local_d98._0_16_ = (undefined1  [16])0x0;
      local_d98._16_16_ = (undefined1  [16])0x0;
      local_d78 = (undefined1  [16])0x0;
      local_d68 = (undefined1  [16])0x0;
      local_d58 = (undefined1  [16])0x0;
      local_d48 = (undefined1  [16])0x0;
      local_d38 = SUB1613((undefined1  [16])0x0,0);
      uStack_d2b = 0;
      iStack_d28 = 0;
      bStack_d24 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d98,dVar5);
      if ((((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_d20 != cpp_dec_float_NaN)) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&(this->m_upper).m_backend,(cpp_dec_float<200U,_int,_void> *)local_d98
                             ), -1 < iVar20)) {
        this_00 = (cpp_dec_float<200u,int,void> *)
                  ((x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *piVar1);
        goto LAB_0057b6d0;
      }
    }
    pnVar2 = &this->m_upper;
    local_a10._0_4_ = cpp_dec_float_finite;
    local_a10._4_4_ = 0x1c;
    local_a88._0_16_ = (undefined1  [16])0x0;
    local_a88._16_16_ = (undefined1  [16])0x0;
    local_a68 = (undefined1  [16])0x0;
    local_a58 = (undefined1  [16])0x0;
    local_a48 = (undefined1  [16])0x0;
    local_a38 = (undefined1  [16])0x0;
    local_a28 = SUB1613((undefined1  [16])0x0,0);
    uStack_a1b = 0;
    iStack_a18 = 0;
    bStack_a14 = false;
    pcVar22 = &pnVar28->m_backend;
    if (((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_a88 != pnVar2) &&
       (pcVar22 = &pnVar2->m_backend,
       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *)local_a88 != pnVar28)) {
      puVar29 = (uint *)local_a88;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        *puVar29 = (pnVar28->m_backend).data._M_elems[0];
        pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
        puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      }
      iStack_a18 = (this->m_lower).m_backend.exp;
      bStack_a14 = (this->m_lower).m_backend.neg;
      local_a10._0_4_ = (this->m_lower).m_backend.fpclass;
      local_a10._4_4_ = (this->m_lower).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              ((cpp_dec_float<200U,_int,_void> *)local_a88,pcVar22);
    local_d20._0_4_ = cpp_dec_float_finite;
    local_d20._4_4_ = 0x1c;
    local_d98._0_16_ = (undefined1  [16])0x0;
    local_d98._16_16_ = (undefined1  [16])0x0;
    local_d78 = (undefined1  [16])0x0;
    local_d68 = (undefined1  [16])0x0;
    local_d58 = (undefined1  [16])0x0;
    local_d48 = (undefined1  [16])0x0;
    local_d38 = SUB1613((undefined1  [16])0x0,0);
    uStack_d2b = 0;
    iStack_d28 = 0;
    bStack_d24 = false;
    local_de0[0]._0_4_ = cpp_dec_float_finite;
    local_de0[0]._4_4_ = 0x1c;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8[0] = 0;
    local_df8[1] = 0;
    stack0xfffffffffffff210 = 0;
    uStack_deb = 0;
    iStack_de8 = 0;
    bStack_de4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e58,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_d98,
               (cpp_dec_float<200U,_int,_void> *)local_a88,
               (cpp_dec_float<200U,_int,_void> *)local_e58);
    iVar20 = *piVar1;
    pnVar35 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_d98;
    pnVar26 = pnVar35 + iVar20;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar40 * -8 + 4);
      pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    pnVar35[iVar20].m_backend.exp = iStack_d28;
    pnVar35[iVar20].m_backend.neg = bStack_d24;
    pnVar35[iVar20].m_backend.fpclass = (fpclass_type)local_d20;
    pnVar35[iVar20].m_backend.prec_elem = local_d20._4_4_;
    ppVVar27 = &cStatus->data;
    VVar37 = FIXED;
    piVar38 = local_db8;
    goto LAB_0057b8ad;
  case ZERO:
    goto switchD_0057a8a0_caseD_3;
  case BASIC:
    local_dc0 = &(this->m_lower).m_backend;
    pnVar28 = &this->m_lower;
    puVar29 = local_430;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar29 = (pnVar28->m_backend).data._M_elems[0];
      pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
    }
    local_dc4 = (this->m_lower).m_backend.exp;
    bVar8 = (this->m_lower).m_backend.neg;
    puVar29 = (uint *)local_b08;
    puVar33 = local_4a0;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar33 = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      puVar33 = puVar33 + (ulong)bVar40 * -2 + 1;
    }
    local_da0 = (cpp_dec_float<200U,_int,_void> *)CONCAT44(local_da0._4_4_,iStack_a98);
    (*(this->super_PostStep)._vptr_PostStep[6])(local_b0,this);
    puVar29 = local_430;
    psVar34 = (soplex *)local_d98;
    for (lVar24 = 0x1c; uVar19 = local_a90, lVar24 != 0; lVar24 = lVar24 + -1) {
      *(uint *)psVar34 = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      psVar34 = psVar34 + (ulong)bVar40 * -8 + 4;
    }
    iStack_d28 = local_dc4;
    bStack_d24 = bVar8;
    local_d20._0_4_ = (this->m_lower).m_backend.fpclass;
    local_d20._4_4_ = (this->m_lower).m_backend.prec_elem;
    puVar29 = local_4a0;
    pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_a88;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pnVar28->m_backend).data._M_elems[0] = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar28 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    iStack_a18 = (int)local_da0;
    bStack_a14 = bVar39;
    local_a90._0_4_ = (fpclass_type)uVar13;
    local_a90._4_4_ = SUB84(uVar13,4);
    local_a10._0_4_ = (fpclass_type)local_a90;
    local_a10._4_4_ = local_a90._4_4_;
    local_a90 = uVar19;
    relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_e58,(soplex *)local_d98,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a88,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((ulong)local_da0 & 0xffffffff));
    puVar29 = local_b0;
    pcVar22 = &local_600;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pcVar22->data)._M_elems[0] = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    local_600.exp = local_40;
    local_600.neg = (bool)local_3c;
    local_600.fpclass = local_38;
    local_600.prec_elem = iStack_34;
    if (local_600.data._M_elems[0] != 0 || (fpclass_type)_local_38 != cpp_dec_float_finite) {
      local_600.neg = (bool)(local_3c ^ 1);
    }
    if ((((fpclass_type)_local_38 != cpp_dec_float_NaN) &&
        ((fpclass_type)local_de0[0] != cpp_dec_float_NaN)) &&
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_e58,&local_600), 0 < iVar20)) {
      ::soplex::infinity::__tls_init();
      local_de0[0]._0_4_ = cpp_dec_float_finite;
      local_de0[0]._4_4_ = 0x1c;
      local_e58 = (undefined1  [16])0x0;
      local_e48 = (undefined1  [16])0x0;
      local_e38 = (undefined1  [16])0x0;
      local_e28 = (undefined1  [16])0x0;
      local_e18 = (undefined1  [16])0x0;
      local_e08 = (undefined1  [16])0x0;
      local_df8[0] = 0;
      local_df8[1] = 0;
      stack0xfffffffffffff210 = 0;
      uStack_deb = 0;
      iStack_de8 = 0;
      bStack_de4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_e58,
                 (double)(*(ulong *)(in_FS_OFFSET + -8) ^ (ulong)DAT_005f4010));
      if ((((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_de0[0] != cpp_dec_float_NaN)) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (local_dc0,(cpp_dec_float<200U,_int,_void> *)local_e58),
         piVar38 = local_db8, 0 < iVar20)) {
        iVar20 = this->m_j;
        pnVar35 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar22 = local_dc0;
        pnVar26 = pnVar35 + iVar20;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar40 * -8 + 4);
          pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
        }
        pnVar35[iVar20].m_backend.exp = (this->m_lower).m_backend.exp;
        pnVar35[iVar20].m_backend.neg = (this->m_lower).m_backend.neg;
        uVar12 = (this->m_lower).m_backend.fpclass;
        uVar16 = (this->m_lower).m_backend.prec_elem;
        pnVar35[iVar20].m_backend.fpclass = uVar12;
        pnVar35[iVar20].m_backend.prec_elem = uVar16;
        VVar37 = ON_LOWER;
        if ((uVar12 != 2) && ((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (local_dc0,&(this->m_upper).m_backend);
          VVar37 = (iVar20 == 0) + ON_LOWER;
        }
        break;
      }
    }
    uVar13 = local_b10;
    bVar39 = bStack_b14;
    iVar20 = iStack_b18;
    local_da0 = &(this->m_upper).m_backend;
    pnVar28 = &this->m_upper;
    puVar29 = local_510;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar29 = (pnVar28->m_backend).data._M_elems[0];
      pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar28 + (ulong)bVar40 * -8 + 4);
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
    }
    local_dc4 = (this->m_upper).m_backend.exp;
    bVar8 = (this->m_upper).m_backend.neg;
    puVar29 = (uint *)local_b88;
    puVar33 = local_580;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar33 = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      puVar33 = puVar33 + (ulong)bVar40 * -2 + 1;
    }
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_880,this);
    puVar29 = local_510;
    psVar34 = (soplex *)local_d98;
    for (lVar24 = 0x1c; uVar19 = local_b10, lVar24 != 0; lVar24 = lVar24 + -1) {
      *(uint *)psVar34 = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      psVar34 = psVar34 + (ulong)bVar40 * -8 + 4;
    }
    iStack_d28 = local_dc4;
    bStack_d24 = bVar8;
    local_d20._0_4_ = (this->m_upper).m_backend.fpclass;
    local_d20._4_4_ = (this->m_upper).m_backend.prec_elem;
    puVar29 = local_580;
    pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_a88;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pnVar28->m_backend).data._M_elems[0] = *puVar29;
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
      pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar28 + ((ulong)bVar40 * -2 + 1) * 4);
    }
    iStack_a18 = iVar20;
    bStack_a14 = bVar39;
    local_b10._0_4_ = (fpclass_type)uVar13;
    local_b10._4_4_ = SUB84(uVar13,4);
    local_a10._0_4_ = (fpclass_type)local_b10;
    local_a10._4_4_ = local_b10._4_4_;
    local_b10 = uVar19;
    relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_e58,(soplex *)local_d98,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a88,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)0x0);
    piVar23 = local_db8;
    if ((((fpclass_type)local_de0[0] != cpp_dec_float_NaN) &&
        (local_880.fpclass != cpp_dec_float_NaN)) &&
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_e58,&local_880),
       piVar23 = local_db8, iVar20 < 1)) {
      ::soplex::infinity::__tls_init();
      local_de0[0]._0_4_ = cpp_dec_float_finite;
      local_de0[0]._4_4_ = 0x1c;
      local_e58 = (undefined1  [16])0x0;
      local_e48 = (undefined1  [16])0x0;
      local_e38 = (undefined1  [16])0x0;
      local_e28 = (undefined1  [16])0x0;
      local_e18 = (undefined1  [16])0x0;
      local_e08 = (undefined1  [16])0x0;
      local_df8[0] = 0;
      local_df8[1] = 0;
      stack0xfffffffffffff210 = 0;
      uStack_deb = 0;
      iStack_de8 = 0;
      bStack_de4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_e58,*(double *)(in_FS_OFFSET + -8));
      pcVar22 = local_da0;
      if ((((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_de0[0] != cpp_dec_float_NaN)) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (local_da0,(cpp_dec_float<200U,_int,_void> *)local_e58), iVar20 < 0)) {
        iVar20 = this->m_j;
        pnVar35 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar31 = pcVar22;
        pnVar26 = pnVar35 + iVar20;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pcVar31->data)._M_elems[0];
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar40 * -8 + 4);
          pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
        }
        pnVar35[iVar20].m_backend.exp = (this->m_upper).m_backend.exp;
        pnVar35[iVar20].m_backend.neg = (this->m_upper).m_backend.neg;
        iVar17 = (this->m_upper).m_backend.prec_elem;
        pnVar35[iVar20].m_backend.fpclass = (this->m_upper).m_backend.fpclass;
        pnVar35[iVar20].m_backend.prec_elem = iVar17;
        VVar37 = ON_UPPER;
        piVar38 = piVar23;
        if (((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
           ((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (local_dc0,pcVar22);
          VVar37 = (uint)(iVar20 == 0) * 2;
        }
        break;
      }
    }
    ::soplex::infinity::__tls_init();
    ppVVar27 = &rStatus->data;
    dVar5 = *(double *)(in_FS_OFFSET + -8);
    local_de0[0]._0_4_ = cpp_dec_float_finite;
    local_de0[0]._4_4_ = 0x1c;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08 = (undefined1  [16])0x0;
    local_df8[0] = 0;
    local_df8[1] = 0;
    stack0xfffffffffffff210 = 0;
    uStack_deb = 0;
    iStack_de8 = 0;
    bStack_de4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e58,-dVar5);
    piVar38 = piVar23;
    if ((((fpclass_type)local_a90 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_de0[0] == cpp_dec_float_NaN)) ||
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_b08,
                            (cpp_dec_float<200U,_int,_void> *)local_e58), iVar20 < 1)) {
      ::soplex::infinity::__tls_init();
      local_de0[0]._0_4_ = cpp_dec_float_finite;
      local_de0[0]._4_4_ = 0x1c;
      local_e58 = (undefined1  [16])0x0;
      local_e48 = (undefined1  [16])0x0;
      local_e38 = (undefined1  [16])0x0;
      local_e28 = (undefined1  [16])0x0;
      local_e18 = (undefined1  [16])0x0;
      local_e08 = (undefined1  [16])0x0;
      local_df8[0] = 0;
      local_df8[1] = 0;
      stack0xfffffffffffff210 = 0;
      uStack_deb = 0;
      iStack_de8 = 0;
      bStack_de4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_e58,dVar5);
      if ((((fpclass_type)local_b10 == cpp_dec_float_NaN) ||
          ((fpclass_type)local_de0[0] == cpp_dec_float_NaN)) ||
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_b88,
                              (cpp_dec_float<200U,_int,_void> *)local_e58), -1 < iVar20)) {
        puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_e58._0_8_ = local_e48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e58,"XMAISM03 This should never happen.","");
        *puVar21 = &PTR__SPxException_0069d438;
        puVar21[1] = puVar21 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar21 + 1),local_e58._0_8_,
                   (undefined1 *)(local_e58._0_8_ + local_e58._8_8_));
        *puVar21 = &PTR__SPxException_0069d410;
        __cxa_throw(puVar21,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      iVar20 = *piVar1;
      pnVar35 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar30 = (undefined4 *)local_b88;
      pnVar26 = pnVar35 + iVar20;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = *puVar30;
        puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
        pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
      }
      pnVar35[iVar20].m_backend.exp = iStack_b18;
      pnVar35[iVar20].m_backend.neg = bStack_b14;
      pnVar35[iVar20].m_backend.fpclass = (fpclass_type)local_b10;
      pnVar35[iVar20].m_backend.prec_elem = local_b10._4_4_;
      cStatus->data[*piVar1] = BASIC;
      VVar37 = ON_LOWER;
      if (local_d18.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_e58,0,(type *)0x0);
        iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_e58);
        VVar37 = (VarStatus)(iVar20 < 1);
      }
    }
    else {
      iVar20 = *piVar1;
      pnVar35 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar30 = (undefined4 *)local_b08;
      pnVar26 = pnVar35 + iVar20;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = *puVar30;
        puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
        pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
      }
      pnVar35[iVar20].m_backend.exp = iStack_a98;
      pnVar35[iVar20].m_backend.neg = bStack_a94;
      pnVar35[iVar20].m_backend.fpclass = (fpclass_type)local_a90;
      pnVar35[iVar20].m_backend.prec_elem = local_a90._4_4_;
      cStatus->data[*piVar1] = BASIC;
      VVar37 = ON_UPPER;
      if (local_d18.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_e58,0,(type *)0x0);
        iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d18,(cpp_dec_float<200U,_int,_void> *)local_e58);
        VVar37 = (VarStatus)(0 < iVar20);
      }
    }
    goto LAB_0057b8ad;
  }
  ppVVar27 = &cStatus->data;
  piVar23 = piVar1;
LAB_0057b8ad:
  (*ppVVar27)[*piVar23] = VVar37;
  pcVar31 = &(x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*piVar1].m_backend;
  local_de0[0]._0_4_ = cpp_dec_float_finite;
  local_de0[0]._4_4_ = 0x1c;
  local_e58 = (undefined1  [16])0x0;
  local_e48 = (undefined1  [16])0x0;
  local_e38 = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08 = (undefined1  [16])0x0;
  local_df8[0] = 0;
  local_df8[1] = 0;
  stack0xfffffffffffff210 = 0;
  uStack_deb = 0;
  iStack_de8 = 0;
  bStack_de4 = false;
  pcVar22 = &local_d18;
  if ((cpp_dec_float<200U,_int,_void> *)local_e58 != pcVar31) {
    pcVar22 = &local_d18;
    puVar29 = (uint *)local_e58;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar29 = (pcVar22->data)._M_elems[0];
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar40 * -2 + 1) * 4);
      puVar29 = puVar29 + (ulong)bVar40 * -2 + 1;
    }
    iStack_de8 = local_d18.exp;
    bStack_de4 = local_d18.neg;
    local_de0[0]._4_4_ = local_d18.prec_elem;
    local_de0[0]._0_4_ = local_d18.fpclass;
    pcVar22 = pcVar31;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_e58,pcVar22);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
            (&(local_dd0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[*piVar38].m_backend,
             (cpp_dec_float<200U,_int,_void> *)local_e58);
  local_de0[0]._0_4_ = cpp_dec_float_finite;
  local_de0[0]._4_4_ = 0x1c;
  local_e58 = (undefined1  [16])0x0;
  local_e48 = (undefined1  [16])0x0;
  local_e38 = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08 = (undefined1  [16])0x0;
  local_df8[0] = 0;
  local_df8[1] = 0;
  stack0xfffffffffffff210 = 0;
  uStack_deb = 0;
  iStack_de8 = 0;
  bStack_de4 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_e58,-1.0);
  pcVar22 = &local_d18;
  pcVar31 = (cpp_dec_float<200U,_int,_void> *)local_d98;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    (pcVar31->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar40 * -2 + 1) * 4);
    pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar40 * -8 + 4);
  }
  iStack_d28 = local_d18.exp;
  bStack_d24 = local_d18.neg;
  local_d20._4_4_ = local_d18.prec_elem;
  local_d20._0_4_ = local_d18.fpclass;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_d98,(cpp_dec_float<200U,_int,_void> *)local_e58
            );
  pVVar18 = local_c98;
  pcVar31 = &(local_c90->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*piVar38].m_backend;
  local_de0[0]._0_4_ = cpp_dec_float_finite;
  local_de0[0]._4_4_ = 0x1c;
  local_e58 = ZEXT816(0);
  local_e48 = ZEXT816(0);
  local_e38 = ZEXT816(0);
  local_e28 = ZEXT816(0);
  local_e18 = ZEXT816(0);
  local_e08 = ZEXT816(0);
  local_df8[0] = 0;
  local_df8[1] = 0;
  stack0xfffffffffffff210 = 0;
  uStack_deb = 0;
  iStack_de8 = 0;
  bStack_de4 = false;
  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_d98;
  if ((cpp_dec_float<200U,_int,_void> *)local_e58 != pcVar31) {
    puVar30 = (undefined4 *)local_d98;
    puVar36 = (undefined4 *)local_e58;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar36 = *puVar30;
      puVar30 = puVar30 + (ulong)bVar40 * -2 + 1;
      puVar36 = puVar36 + (ulong)bVar40 * -2 + 1;
    }
    iStack_de8 = iStack_d28;
    bStack_de4 = bStack_d24;
    local_de0[0]._0_4_ = (fpclass_type)local_d20;
    local_de0[0]._4_4_ = local_d20._4_4_;
    pcVar22 = pcVar31;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_e58,pcVar22);
  iVar20 = *piVar1;
  pnVar35 = (pVVar18->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_e58;
  pnVar26 = pnVar35 + iVar20;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar40 * -8 + 4);
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar40 * -2 + 1) * 4);
  }
  pnVar35[iVar20].m_backend.exp = iStack_de8;
  pnVar35[iVar20].m_backend.neg = bStack_de4;
  pnVar35[iVar20].m_backend.fpclass = (fpclass_type)local_de0[0];
  pnVar35[iVar20].m_backend.prec_elem = local_de0[0]._4_4_;
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}